

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O3

Frag __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Frag>::WalkInternal
          (Walker<duckdb_re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  uint32_t uVar3;
  undefined8 uVar4;
  undefined4 uVar9;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar12;
  undefined4 extraout_var_00;
  uint32_t extraout_var_01;
  uint32_t extraout_var_02;
  _Elt_pointer pWVar13;
  Frag *pFVar14;
  uint uVar15;
  undefined8 uVar16;
  long lVar17;
  Frag *pFVar18;
  uint32_t uVar19;
  undefined8 uVar20;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  Regexp *pRVar21;
  ulong uVar22;
  bool *pbVar23;
  byte bVar24;
  Frag FVar25;
  undefined4 uVar26;
  uint32_t uStack_1c4;
  undefined4 uVar27;
  undefined4 uStack_1bc;
  bool stop;
  int local_1a8;
  Frag local_1a4;
  uint32_t local_194;
  PatchList local_190;
  bool local_188;
  uint32_t local_184;
  PatchList local_180;
  bool local_178;
  Frag *local_170;
  ios_base local_138 [264];
  
  uVar16 = top_arg._8_8_;
  uVar20 = top_arg._0_8_;
  bVar24 = 0;
  Reset(this);
  if (re == (Regexp *)0x0) {
    _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this_00 = &this->stack_;
    _stop = re;
    local_1a8 = -1;
    local_1a4.begin = (uint32_t)uVar20;
    local_1a4.end.head = SUB84(uVar20,4);
    local_1a4.end.tail = (uint32_t)uVar16;
    local_1a4.nullable = SUB81(uVar16,4);
    local_1a4._13_3_ = SUB83(uVar16,5);
    local_194 = 0;
    local_190.head = 0;
    local_190.tail = 0;
    local_188 = false;
    local_184 = 0;
    local_180.head = 0;
    local_180.tail = 0;
    local_178 = false;
    local_170 = (Frag *)0x0;
    pWVar13 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar13 ==
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
      ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Frag>>
                ((deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
                  *)this_00,(WalkState<duckdb_re2::Frag> *)&stop);
    }
    else {
      pbVar23 = &stop;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        pWVar13->re = *(Regexp **)pbVar23;
        pbVar23 = pbVar23 + (ulong)bVar24 * -0x10 + 8;
        pWVar13 = (_Elt_pointer)((long)pWVar13 + (ulong)bVar24 * -0x10 + 8);
      }
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
LAB_0182d26e:
    while( true ) {
      uVar26 = 0;
      uVar27 = 0;
      pWVar13 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar13 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar13 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      pRVar21 = pWVar13[-1].re;
      uVar22 = (ulong)(uint)pWVar13[-1].n;
      if (pWVar13[-1].n == 0xffffffff) break;
LAB_0182d2a7:
      uVar2 = pRVar21->nsub_;
      if (uVar2 == 0) {
LAB_0182d398:
        uVar6._0_4_ = pWVar13[-1].parent_arg.begin;
        uVar6._4_4_ = pWVar13[-1].parent_arg.end.head;
        uVar7._0_4_ = pWVar13[-1].pre_arg.begin;
        uVar7._4_4_ = pWVar13[-1].pre_arg.end.head;
        uVar3 = (*this->_vptr_Walker[3])
                          (this,pRVar21,uVar6,*(undefined8 *)&pWVar13[-1].parent_arg.end.tail,uVar7,
                           *(undefined8 *)&pWVar13[-1].pre_arg.end.tail,pWVar13[-1].child_args,
                           uVar22,uVar26,uVar27);
        uVar19 = (uint32_t)extraout_RDX_01;
        uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_01 >> 0x20));
        uStack_1c4 = extraout_var_01;
        if ((1 < pRVar21->nsub_) && (pWVar13[-1].child_args != (Frag *)0x0)) {
          operator_delete__(pWVar13[-1].child_args);
        }
        goto LAB_0182d416;
      }
      if (uVar2 == 1) {
        paVar12 = &pRVar21->field_5;
      }
      else {
        paVar12 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar21->field_5).submany_;
      }
      iVar10 = (int)uVar22;
      if ((int)(uint)uVar2 <= iVar10) goto LAB_0182d398;
      if (use_copy && 0 < iVar10) {
        uVar15 = iVar10 - 1;
        pRVar21 = (Regexp *)paVar12[uVar22].submany_;
        if ((Regexp *)paVar12[uVar15].submany_ != pRVar21) goto LAB_0182d4b4;
        pFVar18 = pWVar13[-1].child_args + uVar15;
        uVar5._0_4_ = pFVar18->begin;
        uVar5._4_4_ = (pFVar18->end).head;
        iVar11 = (*this->_vptr_Walker[4])
                           (this,uVar5,*(undefined8 *)&pWVar13[-1].child_args[uVar15].end.tail);
        pFVar18 = pWVar13[-1].child_args;
        iVar10 = pWVar13[-1].n;
        pFVar18[iVar10].begin = iVar11;
        pFVar18[iVar10].end.head = extraout_var_00;
        pFVar18[iVar10].end.tail = (uint32_t)extraout_RDX_00;
        pFVar18[iVar10].nullable = SUB81((ulong)extraout_RDX_00 >> 0x20,0);
        pWVar13[-1].n = pWVar13[-1].n + 1;
      }
      else {
        pRVar21 = (Regexp *)paVar12[iVar10].submany_;
LAB_0182d4b4:
        _stop = pRVar21;
        local_1a8 = -1;
        local_1a4.begin = pWVar13[-1].pre_arg.begin;
        local_1a4.end.head = pWVar13[-1].pre_arg.end.head;
        local_1a4._8_8_ = *(undefined8 *)&pWVar13[-1].pre_arg.end.tail;
        local_194 = 0;
        local_190.head = 0;
        local_190.tail = 0;
        local_188 = false;
        local_184 = 0;
        local_180.head = 0;
        local_180.tail = 0;
        local_178 = false;
        local_170 = (Frag *)0x0;
        pWVar13 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pWVar13 ==
            (this->stack_).c.
            super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::
          deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
          ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Frag>>
                    ((deque<duckdb_re2::WalkState<duckdb_re2::Frag>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>>>
                      *)this_00,(WalkState<duckdb_re2::Frag> *)&stop);
        }
        else {
          pbVar23 = &stop;
          for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
            pWVar13->re = *(Regexp **)pbVar23;
            pbVar23 = pbVar23 + (ulong)bVar24 * -0x10 + 8;
            pWVar13 = (_Elt_pointer)((long)pWVar13 + (ulong)bVar24 * -0x10 + 8);
          }
          piVar1 = &(this->stack_).c.
                    super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
    }
    iVar10 = this->max_visits_;
    this->max_visits_ = iVar10 + -1;
    if (iVar10 < 1) {
      this->stopped_early_ = true;
      uVar8._0_4_ = pWVar13[-1].parent_arg.begin;
      uVar8._4_4_ = pWVar13[-1].parent_arg.end.head;
      uVar3 = (*this->_vptr_Walker[5])
                        (this,pRVar21,uVar8,*(undefined8 *)&pWVar13[-1].parent_arg.end.tail);
      uVar19 = (uint32_t)extraout_RDX_02;
      uStack_1bc = CONCAT31(uStack_1bc._1_3_,(char)((ulong)extraout_RDX_02 >> 0x20));
      uStack_1c4 = extraout_var_02;
    }
    else {
      _stop = (Regexp *)((ulong)_stop & 0xffffffffffffff00);
      uVar4._0_4_ = pWVar13[-1].parent_arg.begin;
      uVar4._4_4_ = pWVar13[-1].parent_arg.end.head;
      iVar10 = (*this->_vptr_Walker[2])
                         (this,pRVar21,uVar4,*(undefined8 *)&pWVar13[-1].parent_arg.end.tail,&stop);
      pWVar13[-1].pre_arg.begin = iVar10;
      pWVar13[-1].pre_arg.end.head = extraout_var;
      pWVar13[-1].pre_arg.end.tail = (uint32_t)extraout_RDX;
      pWVar13[-1].pre_arg.nullable = SUB81((ulong)extraout_RDX >> 0x20,0);
      if (stop == false) {
        pWVar13[-1].n = 0;
        pWVar13[-1].child_args = (Frag *)0x0;
        uVar2 = pRVar21->nsub_;
        uVar22 = (ulong)uVar2;
        if (uVar2 != 0) {
          if (uVar2 == 1) {
            pWVar13[-1].child_args = &pWVar13[-1].child_arg;
            uVar22 = 0;
          }
          else {
            pFVar14 = (Frag *)operator_new__((ulong)uVar2 * 0x10);
            pFVar18 = pFVar14;
            do {
              pFVar18->begin = 0;
              (pFVar18->end).head = 0;
              (pFVar18->end).tail = 0;
              pFVar18->nullable = false;
              pFVar18 = pFVar18 + 1;
            } while (pFVar18 != pFVar14 + uVar2);
            pWVar13[-1].child_args = pFVar14;
            uVar22 = (ulong)(uint)pWVar13[-1].n;
          }
        }
        goto LAB_0182d2a7;
      }
      uVar3 = pWVar13[-1].pre_arg.begin;
      uVar9 = pWVar13[-1].pre_arg.end.head;
      uVar20 = *(undefined8 *)((long)&pWVar13[-1].pre_arg.end.head + 1);
      uVar19 = (uint32_t)((ulong)uVar20 >> 0x18);
      uStack_1bc._0_1_ = (undefined1)((ulong)uVar20 >> 0x38);
      uStack_1c4 = uVar9;
    }
LAB_0182d416:
    std::
    deque<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
    ::pop_back(&this_00->c);
    pWVar13 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pWVar13 !=
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pWVar13 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar13 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Frag>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Frag>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 7;
      }
      if (pWVar13[-1].child_args == (Frag *)0x0) {
        pFVar18 = &pWVar13[-1].child_arg;
      }
      else {
        pFVar18 = pWVar13[-1].child_args + pWVar13[-1].n;
      }
      *(ulong *)((long)&(pFVar18->end).head + 1) =
           CONCAT17((undefined1)uStack_1bc,CONCAT43(uVar19,uStack_1c4._1_3_));
      pFVar18->begin = uVar3;
      (pFVar18->end).head = uStack_1c4;
      pWVar13[-1].n = pWVar13[-1].n + 1;
      goto LAB_0182d26e;
    }
    uVar20._4_4_ = uStack_1c4;
    uVar20._0_4_ = uVar3;
    uVar16._4_4_ = uStack_1bc;
    uVar16._0_4_ = uVar19;
  }
  FVar25.end.tail = (uint32_t)uVar16;
  FVar25.nullable = SUB81(uVar16,4);
  FVar25._13_3_ = SUB83(uVar16,5);
  FVar25.begin = (uint32_t)uVar20;
  FVar25.end.head = SUB84(uVar20,4);
  return FVar25;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}